

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_chrome_tracing.cpp
# Opt level: O2

void __thiscall
KokkosTools::ChromeTracing::State::begin_deep_copy
          (State *this,Space dst,char *dst_name,void *param_3,Space src,char *src_name,void *param_6
          ,uint64_t len)

{
  string frame_name;
  string local_40;
  
  frame_name._M_dataplus._M_p = (pointer)&frame_name.field_2;
  frame_name._M_string_length = 0;
  frame_name.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::append((char *)&frame_name);
  std::__cxx11::string::append((char *)&frame_name);
  std::__cxx11::string::push_back((char)&frame_name);
  std::__cxx11::string::append((char *)&frame_name);
  std::__cxx11::string::append((char *)&frame_name);
  std::__cxx11::string::append((char *)&frame_name);
  std::__cxx11::string::push_back((char)&frame_name);
  std::__cxx11::string::append((char *)&frame_name);
  std::__cxx11::to_string(&local_40,len);
  std::__cxx11::string::append((string *)&frame_name);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::append((char *)&frame_name);
  begin_frame(this,frame_name._M_dataplus._M_p,STACK_COPY);
  std::__cxx11::string::~string((string *)&frame_name);
  return;
}

Assistant:

void begin_deep_copy(Space dst, const char *dst_name, const void *, Space src,
                       const char *src_name, const void *, std::uint64_t len) {
    std::string frame_name;
    frame_name += dst_name;
    frame_name += " SPACE ";
    frame_name += (dst == SPACE_HOST) ? 'H' : 'D';
    frame_name += " COPYFROM ";
    frame_name += src_name;
    frame_name += " SPACE ";
    frame_name += (src == SPACE_HOST) ? 'H' : 'D';
    frame_name += " LENGTH ";
    frame_name += std::to_string(len);
    frame_name += " ";
    begin_frame(frame_name.c_str(), STACK_COPY);
  }